

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_dd5232::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  cmLocalGenerator *this_00;
  cmOutputConverter *outputConverter;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_228;
  string local_1f8;
  Value local_1d8;
  string linkPath;
  string frameworkPath;
  string linkFlags;
  string linkLanguageFlags;
  string linkLibs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  undefined8 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  cmLinkLineComputer linkLineComputer;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
  linkLanguageFlags._M_string_length = 0;
  linkLanguageFlags.field_2._M_local_buf[0] = '\0';
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  paVar2 = &linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  linkLibs._M_dataplus._M_p = (pointer)paVar2;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  outputConverter = &this_00->super_cmOutputConverter;
  if (this_00 == (cmLocalGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_1d8,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_228,(cmStateSnapshot *)&local_1d8);
  cmLinkLineComputer::cmLinkLineComputer
            (&linkLineComputer,outputConverter,(cmStateDirectory *)&local_228);
  cmLocalGenerator::GetTargetFlags
            (this_00,&linkLineComputer,this->Config,&linkLibs,&linkLanguageFlags,&linkFlags,
             &frameworkPath,&linkPath,this->GT);
  cmSystemTools::TrimWhitespace(&local_228.Value,&linkLanguageFlags);
  std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&local_228);
  paVar1 = &local_228.Value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.Value._M_dataplus._M_p,
                    local_228.Value.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::TrimWhitespace(&local_228.Value,&linkFlags);
  std::__cxx11::string::operator=((string *)&linkFlags,(string *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.Value._M_dataplus._M_p,
                    local_228.Value.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::TrimWhitespace(&local_228.Value,&frameworkPath);
  std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.Value._M_dataplus._M_p,
                    local_228.Value.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::TrimWhitespace(&local_228.Value,&linkPath);
  std::__cxx11::string::operator=((string *)&linkPath,(string *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.Value._M_dataplus._M_p,
                    local_228.Value.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::TrimWhitespace(&local_228.Value,&linkLibs);
  std::__cxx11::string::operator=((string *)&linkLibs,(string *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_228.Value._M_dataplus._M_p,
                    local_228.Value.field_2._M_allocated_capacity + 1);
  }
  sVar3 = linkLanguageFlags._M_string_length;
  if (linkLanguageFlags._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguageFlags._M_dataplus._M_p == &linkLanguageFlags.field_2) {
      local_80._8_8_ = linkLanguageFlags.field_2._8_8_;
      local_90 = &local_80;
    }
    else {
      local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)linkLanguageFlags._M_dataplus._M_p;
    }
    local_80._M_allocated_capacity._1_7_ = linkLanguageFlags.field_2._M_allocated_capacity._1_7_;
    local_80._M_local_buf[0] = linkLanguageFlags.field_2._M_local_buf[0];
    linkLanguageFlags._M_string_length = 0;
    linkLanguageFlags.field_2._M_local_buf[0] = '\0';
    if (local_90 == &local_80) {
      local_228.Value.field_2._8_8_ = local_80._8_8_;
      local_228.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.Value._M_dataplus._M_p = (pointer)local_90;
    }
    local_228.Value.field_2._M_allocated_capacity = local_80._M_allocated_capacity;
    local_228.Value._M_string_length = sVar3;
    local_88 = 0;
    local_80._M_allocated_capacity =
         (ulong)(uint7)linkLanguageFlags.field_2._M_allocated_capacity._1_7_ << 8;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"flags","");
    DumpCommandFragment(&local_1d8,this,&local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_1d8);
    Json::Value::~Value(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_228.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.Value._M_dataplus._M_p,
                      local_228.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80._M_allocated_capacity + 1);
    }
  }
  sVar3 = linkFlags._M_string_length;
  if (linkFlags._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p == &linkFlags.field_2) {
      local_a0._8_8_ = linkFlags.field_2._8_8_;
      local_b0 = &local_a0;
    }
    else {
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)linkFlags._M_dataplus._M_p;
    }
    local_a0._M_allocated_capacity._1_7_ = linkFlags.field_2._M_allocated_capacity._1_7_;
    local_a0._M_local_buf[0] = linkFlags.field_2._M_local_buf[0];
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    if (local_b0 == &local_a0) {
      local_228.Value.field_2._8_8_ = local_a0._8_8_;
      local_228.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.Value._M_dataplus._M_p = (pointer)local_b0;
    }
    local_228.Value.field_2._M_allocated_capacity = local_a0._M_allocated_capacity;
    local_228.Value._M_string_length = sVar3;
    local_a8 = 0;
    local_a0._M_allocated_capacity =
         (ulong)(uint7)linkFlags.field_2._M_allocated_capacity._1_7_ << 8;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"flags","");
    DumpCommandFragment(&local_1d8,this,&local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_1d8);
    Json::Value::~Value(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_228.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.Value._M_dataplus._M_p,
                      local_228.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
    }
  }
  sVar3 = frameworkPath._M_string_length;
  if (frameworkPath._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p == &frameworkPath.field_2) {
      local_c0._8_8_ = frameworkPath.field_2._8_8_;
      local_d0 = &local_c0;
    }
    else {
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)frameworkPath._M_dataplus._M_p;
    }
    local_c0._M_allocated_capacity._1_7_ = frameworkPath.field_2._M_allocated_capacity._1_7_;
    local_c0._M_local_buf[0] = frameworkPath.field_2._M_local_buf[0];
    frameworkPath._M_string_length = 0;
    frameworkPath.field_2._M_local_buf[0] = '\0';
    if (local_d0 == &local_c0) {
      local_228.Value.field_2._8_8_ = local_c0._8_8_;
      local_228.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.Value._M_dataplus._M_p = (pointer)local_d0;
    }
    local_228.Value.field_2._M_allocated_capacity = local_c0._M_allocated_capacity;
    local_228.Value._M_string_length = sVar3;
    local_c8 = 0;
    local_c0._M_allocated_capacity =
         (ulong)(uint7)frameworkPath.field_2._M_allocated_capacity._1_7_ << 8;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"frameworkPath","");
    DumpCommandFragment(&local_1d8,this,&local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_1d8);
    Json::Value::~Value(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_228.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.Value._M_dataplus._M_p,
                      local_228.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
    }
  }
  sVar3 = linkPath._M_string_length;
  if (linkPath._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkPath._M_dataplus._M_p == &linkPath.field_2) {
      local_e0._8_8_ = linkPath.field_2._8_8_;
      local_f0 = &local_e0;
    }
    else {
      local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)linkPath._M_dataplus._M_p;
    }
    local_e0._M_allocated_capacity._1_7_ = linkPath.field_2._M_allocated_capacity._1_7_;
    local_e0._M_local_buf[0] = linkPath.field_2._M_local_buf[0];
    linkPath._M_string_length = 0;
    linkPath.field_2._M_local_buf[0] = '\0';
    if (local_f0 == &local_e0) {
      local_228.Value.field_2._8_8_ = local_e0._8_8_;
      local_228.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.Value._M_dataplus._M_p = (pointer)local_f0;
    }
    local_228.Value.field_2._M_allocated_capacity = local_e0._M_allocated_capacity;
    local_228.Value._M_string_length = sVar3;
    local_e8 = 0;
    local_e0._M_allocated_capacity = (ulong)(uint7)linkPath.field_2._M_allocated_capacity._1_7_ << 8
    ;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"libraryPath","");
    DumpCommandFragment(&local_1d8,this,&local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_1d8);
    Json::Value::~Value(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_228.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.Value._M_dataplus._M_p,
                      local_228.Value.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
    }
  }
  sVar3 = linkLibs._M_string_length;
  if (linkLibs._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLibs._M_dataplus._M_p == paVar2) {
      local_100._8_8_ = linkLibs.field_2._8_8_;
      local_110 = &local_100;
    }
    else {
      local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)linkLibs._M_dataplus._M_p;
    }
    local_100._M_allocated_capacity._1_7_ = linkLibs.field_2._M_allocated_capacity._1_7_;
    local_100._M_local_buf[0] = linkLibs.field_2._M_local_buf[0];
    linkLibs._M_string_length = 0;
    linkLibs.field_2._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_228.Value.field_2._8_8_ = local_100._8_8_;
      local_228.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_228.Value._M_dataplus._M_p = (pointer)local_110;
    }
    local_228.Value.field_2._M_allocated_capacity = local_100._M_allocated_capacity;
    local_228.Value._M_string_length = sVar3;
    local_100._M_allocated_capacity =
         (ulong)(uint7)linkLibs.field_2._M_allocated_capacity._1_7_ << 8;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_228.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    linkLibs._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"libraries","");
    DumpCommandFragment(&local_1d8,this,&local_228,&local_1f8);
    Json::Value::append(__return_storage_ptr__,&local_1d8);
    Json::Value::~Value(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_228.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_228.Value._M_dataplus._M_p,
                      local_228.Value.field_2._M_allocated_capacity + 1);
    }
  }
  cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLibs._M_dataplus._M_p != paVar2) {
    operator_delete(linkLibs._M_dataplus._M_p,
                    CONCAT71(linkLibs.field_2._M_allocated_capacity._1_7_,
                             linkLibs.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkFlags._M_dataplus._M_p != &linkFlags.field_2) {
    operator_delete(linkFlags._M_dataplus._M_p,
                    CONCAT71(linkFlags.field_2._M_allocated_capacity._1_7_,
                             linkFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguageFlags._M_dataplus._M_p != &linkLanguageFlags.field_2) {
    operator_delete(linkLanguageFlags._M_dataplus._M_p,
                    CONCAT71(linkLanguageFlags.field_2._M_allocated_capacity._1_7_,
                             linkLanguageFlags.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmLinkLineComputer linkLineComputer(lg,
                                      lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(&linkLineComputer, this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
  linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
  frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
  linkPath = cmSystemTools::TrimWhitespace(linkPath);
  linkLibs = cmSystemTools::TrimWhitespace(linkLibs);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkFlags), "flags"));
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkPath), "libraryPath"));
  }

  if (!linkLibs.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLibs), "libraries"));
  }

  return linkFragments;
}